

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void cm_zlib__tr_align(deflate_state *s)

{
  ulg uVar1;
  int val_1;
  int len_1;
  int val;
  int len;
  deflate_state *s_local;
  
  if (s->bi_valid < 0xe) {
    s->bi_buf = s->bi_buf | (ushort)(2 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 3;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(2 << ((byte)s->bi_valid & 0x1f));
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)(2 >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xd;
  }
  if (s->bi_valid < 10) {
    s->bi_buf = s->bi_buf | (ushort)(0 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 7;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(0 << ((byte)s->bi_valid & 0x1f));
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)(0 >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -9;
  }
  bi_flush(s);
  return;
}

Assistant:

void ZLIB_INTERNAL _tr_align(deflate_state *s) {
    send_bits(s, STATIC_TREES<<1, 3);
    send_code(s, END_BLOCK, static_ltree);
#ifdef ZLIB_DEBUG
    s->compressed_len += 10L; /* 3 for block type, 7 for EOB */
#endif
    bi_flush(s);
}